

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall DiceRoller::~DiceRoller(DiceRoller *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  
  operator_delete(this->diceRolled,4);
  pvVar1 = this->history;
  if ((pvVar1 != (vector<int,_std::allocator<int>_> *)0x0) &&
     (piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start, piVar2 != (pointer)0x0)) {
    operator_delete(piVar2,(long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  operator_delete(pvVar1,0x18);
  return;
}

Assistant:

DiceRoller::~DiceRoller() {
    delete diceRolled;
    delete history;
}